

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trainer_factory.cc
# Opt level: O2

unique_ptr<sentencepiece::TrainerInterface,_std::default_delete<sentencepiece::TrainerInterface>_>
sentencepiece::TrainerFactory::Create
          (TrainerSpec *trainer_spec,NormalizerSpec *normalizer_spec,
          NormalizerSpec *denormalizer_spec)

{
  int iVar1;
  char *pcVar2;
  ostream *poVar3;
  Die local_30;
  undefined7 uStack_2f;
  
  switch(*(undefined4 *)(normalizer_spec + 0x118)) {
  case 2:
    std::
    make_unique<sentencepiece::bpe::Trainer,sentencepiece::TrainerSpec_const&,sentencepiece::NormalizerSpec_const&,sentencepiece::NormalizerSpec_const&>
              ((TrainerSpec *)&local_30,normalizer_spec,denormalizer_spec);
    break;
  case 3:
    std::
    make_unique<sentencepiece::word::Trainer,sentencepiece::TrainerSpec_const&,sentencepiece::NormalizerSpec_const&,sentencepiece::NormalizerSpec_const&>
              ((TrainerSpec *)&local_30,normalizer_spec,denormalizer_spec);
    break;
  case 4:
    std::
    make_unique<sentencepiece::character::Trainer,sentencepiece::TrainerSpec_const&,sentencepiece::NormalizerSpec_const&,sentencepiece::NormalizerSpec_const&>
              ((TrainerSpec *)&local_30,normalizer_spec,denormalizer_spec);
    break;
  default:
    iVar1 = sentencepiece::logging::GetMinLogLevel();
    if (iVar1 < 4) {
      local_30.die_ = true;
      pcVar2 = logging::BaseName("src/trainer_factory.cc");
      poVar3 = std::operator<<((ostream *)&std::cerr,pcVar2);
      poVar3 = std::operator<<(poVar3,"(");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x2e);
      poVar3 = std::operator<<(poVar3,") ");
      poVar3 = std::operator<<(poVar3,"LOG(");
      poVar3 = std::operator<<(poVar3,"FATAL");
      poVar3 = std::operator<<(poVar3,") ");
      poVar3 = std::operator<<(poVar3,"Unknown model_type: ");
      std::ostream::operator<<(poVar3,*(int *)(normalizer_spec + 0x118));
      error::Die::~Die(&local_30);
    }
  case 1:
    std::
    make_unique<sentencepiece::unigram::Trainer,sentencepiece::TrainerSpec_const&,sentencepiece::NormalizerSpec_const&,sentencepiece::NormalizerSpec_const&>
              ((TrainerSpec *)&local_30,normalizer_spec,denormalizer_spec);
  }
  *(ulong *)trainer_spec = CONCAT71(uStack_2f,local_30.die_);
  return (__uniq_ptr_data<sentencepiece::TrainerInterface,_std::default_delete<sentencepiece::TrainerInterface>,_true,_true>
          )(__uniq_ptr_data<sentencepiece::TrainerInterface,_std::default_delete<sentencepiece::TrainerInterface>,_true,_true>
            )trainer_spec;
}

Assistant:

std::unique_ptr<TrainerInterface> TrainerFactory::Create(
    const TrainerSpec &trainer_spec, const NormalizerSpec &normalizer_spec,
    const NormalizerSpec &denormalizer_spec) {
  switch (trainer_spec.model_type()) {
    case TrainerSpec::UNIGRAM:
      return std::make_unique<unigram::Trainer>(trainer_spec, normalizer_spec,
                                                denormalizer_spec);
      break;
    case TrainerSpec::BPE:
      return std::make_unique<bpe::Trainer>(trainer_spec, normalizer_spec,
                                            denormalizer_spec);
      break;
    case TrainerSpec::WORD:
      return std::make_unique<word::Trainer>(trainer_spec, normalizer_spec,
                                             denormalizer_spec);
      break;
    case TrainerSpec::CHAR:
      return std::make_unique<character::Trainer>(trainer_spec, normalizer_spec,
                                                  denormalizer_spec);
      break;
    default:
      LOG(FATAL) << "Unknown model_type: " << trainer_spec.model_type();
      break;
  }

  return std::make_unique<unigram::Trainer>(trainer_spec, normalizer_spec,
                                            denormalizer_spec);
}